

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall
myEmployeeCustomConstructor::ArchiveOUTconstructor
          (myEmployeeCustomConstructor *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<double> local_30;
  
  chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(marchive);
  local_30._value = &this->latitude;
  local_30._name = "latitude";
  local_30._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->kids;
  local_48._name = "kids";
  local_48._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

virtual void ArchiveOUTconstructor(ChArchiveOut& marchive)
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeCustomConstructor>();

        // serialize the parameters of the constructor:
        marchive << CHNVP(latitude);
        marchive << CHNVP(kids);
    }